

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Expression * __thiscall soul::StructuralParser::parseAdditionSubtraction(StructuralParser *this)

{
  double *pdVar1;
  bool bVar2;
  Op op;
  Expression *a;
  TokenType token;
  Expression *pEVar3;
  Context context;
  Context CStack_48;
  
  a = parseMultiplyDivide(this);
  do {
    bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::matchesAny<soul::TokenType,soul::TokenType>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,(TokenType)0x2a1a56,(TokenType)0x2c42ab);
    if (bVar2) {
      getContext(&CStack_48,this);
      token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::skip(&this->super_SOULTokeniser);
      op = getBinaryOpForToken(token);
      pEVar3 = parseMultiplyDivide(this);
      a = createBinaryOperator(this,&CStack_48,a,pEVar3,op);
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x2a3459,(TokenType)0x2a3464);
      if ((!bVar2) || (-1 < (this->super_SOULTokeniser).literalIntValue)) {
        bVar2 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                          ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                            *)this,(TokenType)0x2a34fe,(TokenType)0x2a3507,(TokenType)0x2a34ee,
                           (TokenType)0x2a34f6);
        if ((!bVar2) ||
           (pdVar1 = &(this->super_SOULTokeniser).literalDoubleValue,
           0.0 < *pdVar1 || *pdVar1 == 0.0)) {
          return a;
        }
      }
      getContext(&CStack_48,this);
      pEVar3 = parseMultiplyDivide(this);
      a = createBinaryOperator(this,&CStack_48,a,pEVar3,add);
    }
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
              ((RefCountedPtr<soul::SourceCodeText> *)&CStack_48);
  } while( true );
}

Assistant:

AST::Expression& parseAdditionSubtraction()
    {
        for (pool_ref<AST::Expression> a = parseMultiplyDivide();;)
        {
            if (! matchesAny (Operator::plus, Operator::minus))
            {
                // Handle the annoying case where some sloppy coder has written a
                // minus sign without a space after it, e.g. (x -1)
                if ((matchesAny (Token::literalInt32, Token::literalInt64) && literalIntValue < 0)
                     || (matchesAny (Token::literalFloat64, Token::literalFloat32, Token::literalImag32, Token::literalImag64) && literalDoubleValue < 0))
                {
                    auto context = getContext();
                    a = createBinaryOperator (context, a, parseMultiplyDivide(), BinaryOp::Op::add);
                    continue;
                }

                return a;
            }

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseMultiplyDivide(), type);
        }
    }